

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O0

idx_t __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::GetSegmentIndex
          (SegmentTree<duckdb::ColumnSegment,_false> *this,SegmentLock *l,idx_t row_number)

{
  bool bVar1;
  size_type sVar2;
  pointer pCVar3;
  undefined8 uVar4;
  long in_RDI;
  idx_t i;
  string error;
  idx_t segment_index;
  memory_order __b;
  unsigned_long in_stack_fffffffffffffe18;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  allocator *paVar5;
  atomic<unsigned_long> *params;
  undefined4 in_stack_fffffffffffffe38;
  idx_t *in_stack_fffffffffffffe60;
  idx_t in_stack_fffffffffffffe68;
  SegmentLock *in_stack_fffffffffffffe70;
  ulong uVar6;
  SegmentTree<duckdb::ColumnSegment,_false> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  InternalException *in_stack_fffffffffffffec0;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  ulong local_b8;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  idx_t local_38;
  __int_type local_18;
  memory_order local_10;
  int local_c;
  atomic<unsigned_long> *local_8;
  
  bVar1 = TryGetSegmentIndex(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (!bVar1) {
    ::std::__cxx11::string::string(local_58);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_98,"Attempting to find row number \"%lld\" in %lld nodes\n",&local_99);
    ::std::
    vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
    ::size((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
            *)(in_RDI + 0x10));
    StringUtil::Format<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe28,(unsigned_long)in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18);
    ::std::__cxx11::string::operator=(local_58,local_78);
    ::std::__cxx11::string::~string(local_78);
    ::std::__cxx11::string::~string(local_98);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_b8 = 0;
    while( true ) {
      uVar6 = local_b8;
      sVar2 = ::std::
              vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
              ::size((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                      *)(in_RDI + 0x10));
      if (sVar2 <= uVar6) break;
      paVar5 = &local_f9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"Node %lld: Start %lld, Count %lld",paVar5);
      vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                           *)in_stack_fffffffffffffe20);
      params = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
      local_c = 5;
      local_8 = params;
      local_10 = ::std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_18 = (params->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_c == 5) {
        local_18 = (params->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_18 = (params->super___atomic_base<unsigned_long>)._M_i;
      }
      StringUtil::Format<unsigned_long,unsigned_long,unsigned_long>
                ((string *)CONCAT44(local_c,in_stack_fffffffffffffe38),(unsigned_long)params,
                 (unsigned_long)in_stack_fffffffffffffe28,(unsigned_long)in_stack_fffffffffffffe20);
      ::std::__cxx11::string::operator+=(local_58,local_d8);
      ::std::__cxx11::string::~string(local_d8);
      ::std::__cxx11::string::~string(local_f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      local_b8 = local_b8 + 1;
    }
    uVar4 = __cxa_allocate_exception(0x10);
    paVar5 = &local_121;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_120,"Could not find node in column segment tree!\n%s%s",paVar5);
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8,local_58);
    Exception::GetStackTrace_abi_cxx11_(in_stack_fffffffffffffe18);
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_38;
}

Assistant:

idx_t GetSegmentIndex(SegmentLock &l, idx_t row_number) {
		idx_t segment_index;
		if (TryGetSegmentIndex(l, row_number, segment_index)) {
			return segment_index;
		}
		string error;
		error = StringUtil::Format("Attempting to find row number \"%lld\" in %lld nodes\n", row_number, nodes.size());
		for (idx_t i = 0; i < nodes.size(); i++) {
			error += StringUtil::Format("Node %lld: Start %lld, Count %lld", i, nodes[i].row_start,
			                            nodes[i].node->count.load());
		}
		throw InternalException("Could not find node in column segment tree!\n%s%s", error, Exception::GetStackTrace());
	}